

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

int rf_get_size_base64(uchar *input)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  
  if (*input != '\0') {
    puVar4 = input + 4;
    iVar2 = 0;
    do {
      iVar3 = 3;
      if (puVar4[-1] == '=') {
        iVar3 = (puVar4[-2] != '=') + 1;
      }
      iVar2 = iVar2 + iVar3;
      uVar1 = *puVar4;
      puVar4 = puVar4 + 4;
    } while (uVar1 != '\0');
    return iVar2;
  }
  return 0;
}

Assistant:

RF_API int rf_get_size_base64(const unsigned char *input)
{
    int size = 0;

    for (rf_int i = 0; input[4 * i] != 0; i++)
    {
        if (input[4 * i + 3] == '=')
        {
            if (input[4 * i + 2] == '=') size += 1;
            else size += 2;
        } else size += 3;
    }

    return size;
}